

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O1

Col_Word Col_StringBufferValue(Col_Word strbuf)

{
  uint uVar1;
  
  if (strbuf == 0) {
    uVar1 = 0;
  }
  else if ((strbuf & 0xf) == 0) {
    uVar1 = -(uint)((*(byte *)strbuf & 2) == 0) | *(byte *)strbuf & 0xfffffffe;
  }
  else {
    uVar1 = immediateWordTypes[(uint)strbuf & 0x1f];
  }
  if ((uVar1 == 2) && ((*(byte *)(strbuf + 2) & 0xc) == 0)) {
    strbuf = *(Col_Word *)(strbuf + 0x10);
  }
  CommitBuffer(strbuf);
  return *(Col_Word *)(strbuf + 8);
}

Assistant:

Col_Word
Col_StringBufferValue(
    Col_Word strbuf)    /*!< String buffer to get value for. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_STRBUF,strbuf} */
    TYPECHECK_STRBUF(strbuf) return WORD_NIL;

    WORD_UNWRAP(strbuf);

    /*!
     * @sideeffect
     * Commit buffer into accumulated rope.
     */
    CommitBuffer(strbuf);
    return WORD_STRBUF_ROPE(strbuf);
}